

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.h
# Opt level: O1

void __thiscall
state_machine::state_machine::StateMachine<$18d5a8f2$>::~StateMachine
          (StateMachine<_18d5a8f2_> *this)

{
  undefined8 *puVar1;
  variant_type *this_00;
  Empty *t;
  Stopped *t_00;
  Playing *t_01;
  Open *t_02;
  
  this_00 = &this->state_;
  switch((this->state_).index_) {
  case '\0':
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = &PTR__exception_00103d58;
    __cxa_throw(puVar1,&variant::bad_variant_access::typeinfo,std::exception::~exception);
  case '\x01':
    t = (Empty *)this_00;
    variant::
    Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
    ::get<(anonymous_namespace)::Empty,_0>(this_00);
    detail::on_exit<(anonymous_namespace)::Empty,_0>(t);
    break;
  case '\x02':
    t_00 = (Stopped *)this_00;
    variant::
    Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
    ::get<(anonymous_namespace)::Stopped,_0>(this_00);
    detail::on_exit<(anonymous_namespace)::Stopped,_0>(t_00);
    break;
  case '\x03':
    t_02 = (Open *)this_00;
    variant::
    Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
    ::get<(anonymous_namespace)::Open,_0>(this_00);
    detail::on_exit<(anonymous_namespace)::Open,_0>(t_02);
    break;
  case '\x04':
    t_01 = (Playing *)this_00;
    variant::
    Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
    ::get<(anonymous_namespace)::Playing,_0>(this_00);
    detail::on_exit<(anonymous_namespace)::Playing,_0>(t_01);
    break;
  default:
    variant::
    Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
    ::get<(anonymous_namespace)::Paused,_0>(this_00);
  }
  variant::
  Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
  ::~Variant(this_00);
  return;
}

Assistant:

~StateMachine() {
        state_.visit([](auto&& s) { detail::on_exit(std::forward<decltype(s)>(s)); });
    }